

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

string * __thiscall
deqp::RobustBufferAccessBehavior::VertexBufferObjectsTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,VertexBufferObjectsTest *this)

{
  allocator<char> local_19;
  VertexBufferObjectsTest *local_18;
  VertexBufferObjectsTest *this_local;
  
  local_18 = this;
  this_local = (VertexBufferObjectsTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nlayout (location = 0) in vec4 in_vs_position;\n\nvoid main()\n{\n    gl_Position = in_vs_position;\n}\n\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexBufferObjectsTest::getVertexShader()
{
	return std::string("#version 430 core\n"
					   "\n"
					   "layout (location = 0) in vec4 in_vs_position;\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = in_vs_position;\n"
					   "}\n"
					   "\n");
}